

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::BuffersTest::prepareObjects(BuffersTest *this)

{
  GetTransformFeedbacki_v_ProcAddress p_Var1;
  GetTransformFeedbacki64_v_ProcAddress p_Var2;
  TransformFeedbackBufferBase_ProcAddress p_Var3;
  TransformFeedbackBufferRange_ProcAddress p_Var4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 *puVar8;
  undefined1 auVar9 [16];
  GLint allocated_size;
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  p_Var1 = *(GetTransformFeedbacki_v_ProcAddress *)(lVar7 + 0xb28);
  this->m_gl_getTransformFeedbacki_v = p_Var1;
  p_Var2 = *(GetTransformFeedbacki64_v_ProcAddress *)(lVar7 + 0xb20);
  this->m_gl_getTransformFeedbacki64_v = p_Var2;
  p_Var3 = *(TransformFeedbackBufferBase_ProcAddress *)(lVar7 + 0x14b8);
  this->m_gl_TransformFeedbackBufferBase = p_Var3;
  p_Var4 = *(TransformFeedbackBufferRange_ProcAddress *)(lVar7 + 0x14c0);
  this->m_gl_TransformFeedbackBufferRange = p_Var4;
  auVar9._0_4_ = -(uint)((int)((ulong)p_Var1 >> 0x20) == 0 && (int)p_Var1 == 0);
  auVar9._4_4_ = -(uint)((int)p_Var2 == 0 && (int)((ulong)p_Var2 >> 0x20) == 0);
  auVar9._8_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == 0 && (int)p_Var3 == 0);
  auVar9._12_4_ = -(uint)((int)p_Var4 == 0 && (int)((ulong)p_Var4 >> 0x20) == 0);
  iVar5 = movmskps((int)p_Var1,auVar9);
  if (iVar5 == 0) {
    (**(code **)(lVar7 + 0x408))(1,&this->m_xfb_dsa);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCreateTransformFeedbacks have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x28b);
    (**(code **)(lVar7 + 0x6c8))(1,&this->m_bo_a);
    (**(code **)(lVar7 + 0x6c8))(1,&this->m_bo_b);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenBuffers have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                    ,0x290);
    if ((this->m_bo_a == 0) || (this->m_bo_b == 0)) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Buffer object has not been generated and no error has been triggered.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      (**(code **)(lVar7 + 0x40))(0x8c8e);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glBindBuffers have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                      ,0x29d);
      (**(code **)(lVar7 + 0x150))(0x8c8e,0x200,0,0x88ea);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glBufferData have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                      ,0x2a0);
      allocated_size = -1;
      (**(code **)(lVar7 + 0x7a8))(0x8c8e,0x8764,&allocated_size);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glGetBufferParameteriv have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                      ,0x2a6);
      if (allocated_size == 0x200) {
        (**(code **)(lVar7 + 0x40))(0x8c8e,this->m_bo_b);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"glBindBuffers have failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                        ,0x2b2);
        (**(code **)(lVar7 + 0x150))(0x8c8e,0x200,0,0x88ea);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"glBufferData have failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                        ,0x2b5);
        allocated_size = -1;
        (**(code **)(lVar7 + 0x7a8))(0x8c8e,0x8764,&allocated_size);
        dVar6 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar6,"glGetBufferParameteriv have failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                        ,699);
        if (allocated_size == 0x200) {
          (**(code **)(lVar7 + 0x40))(0x8c8e,0);
          dVar6 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar6,"glBindBuffers have failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                          ,0x2c6);
          return;
        }
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Buffer allocation failed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Buffer allocation failed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Function pointers are set to NULL values.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1b0);
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

void BuffersTest::prepareObjects()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching function pointers. */
	m_gl_getTransformFeedbacki_v	  = (GetTransformFeedbacki_v_ProcAddress)gl.getTransformFeedbacki_v;
	m_gl_getTransformFeedbacki64_v	= (GetTransformFeedbacki64_v_ProcAddress)gl.getTransformFeedbacki64_v;
	m_gl_TransformFeedbackBufferBase  = (TransformFeedbackBufferBase_ProcAddress)gl.transformFeedbackBufferBase;
	m_gl_TransformFeedbackBufferRange = (TransformFeedbackBufferRange_ProcAddress)gl.transformFeedbackBufferRange;

	if ((DE_NULL == m_gl_getTransformFeedbacki_v) || (DE_NULL == m_gl_getTransformFeedbacki64_v) ||
		(DE_NULL == m_gl_TransformFeedbackBufferBase) || (DE_NULL == m_gl_TransformFeedbackBufferRange))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function pointers are set to NULL values."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}

	/** @brief XFB object creation */
	gl.createTransformFeedbacks(1, &m_xfb_dsa);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	/* Buffer Objects creation. */
	gl.genBuffers(1, &m_bo_a);
	gl.genBuffers(1, &m_bo_b);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers have failed");

	if ((0 == m_bo_a) || (0 == m_bo_b))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Buffer object has not been generated and no error has been triggered."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}

	/* First buffer memory allocation. */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_a);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_bo_size, NULL, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData have failed");

	/* Sainty check of buffer size */
	glw::GLint allocated_size = -1;

	gl.getBufferParameteriv(GL_TRANSFORM_FEEDBACK_BUFFER, GL_BUFFER_SIZE, &allocated_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBufferParameteriv have failed");

	if (allocated_size != (glw::GLint)s_bo_size)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Buffer allocation failed."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}

	/* Second buffer memory allocation. */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_b);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_bo_size, NULL, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData have failed");

	/* Sainty check of buffer size */
	allocated_size = -1;

	gl.getBufferParameteriv(GL_TRANSFORM_FEEDBACK_BUFFER, GL_BUFFER_SIZE, &allocated_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBufferParameteriv have failed");

	if (allocated_size != (glw::GLint)s_bo_size)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Buffer allocation failed."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");
}